

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-node.h
# Opt level: O0

ValueNode *
mp::pre::CreateArray<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>(BasicValuePresolver *vp)

{
  ValueNode *in_RDI;
  string *in_stack_ffffffffffffffd0;
  BasicValuePresolver *in_stack_ffffffffffffffd8;
  ValueNode *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
  ValueNode::ValueNode
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

inline
ValueNode CreateArray(BasicValuePresolver& vp) { return ValueNode{vp}; }